

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Driver.cpp
# Opt level: O2

void __thiscall hdc::Driver::parseProgram(Driver *this)

{
  SourceFile *file;
  string local_30;
  
  std::__cxx11::string::string((string *)&local_30,(string *)&this->mainFilePath);
  file = parseFile(this,&local_30);
  parseImports(this,file);
  std::__cxx11::string::~string((string *)&local_30);
  return;
}

Assistant:

void Driver::parseProgram() {
    /*Lex p;
    std::vector<Token> v = p.getTokens(mainFilePath);
    for (int i = 0; i < v.size(); ++i) {
        std::cout << v[i].toStr() << std::endl;
    }*/

    parseImports(parseFile(mainFilePath));
}